

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O3

void __thiscall
JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
          (JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *this,Cycles *args)

{
  ACIA *this_00;
  uint uVar1;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_00596780
  ;
  this_00 = &this->object_;
  Motorola::ACIA::ACIA::ACIA
            (this_00,(HalfCycles)((args->super_WrappedInt<Cycles>).length_ * 2),(HalfCycles)0x0);
  (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->time_until_event_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->time_overrun_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->is_flushed_ = true;
  this->did_flush_ = false;
  this->clocking_preference_ = JustInTime;
  (this->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
  (this->object_).super_Source.observer_ = &this->super_Observer;
  uVar1 = (**(this->object_).super_Source._vptr_Source)(this_00);
  (**(this->super_Observer)._vptr_Observer)(this,this_00,(ulong)uVar1);
  return;
}

Assistant:

JustInTimeActor(Args&&... args) : object_(std::forward<Args>(args)...) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				object_.set_clocking_hint_observer(this);
			}
		}